

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_init_userdefined(Curl_easy *data)

{
  CURLcode result;
  UserDefined *set;
  Curl_easy *data_local;
  
  (data->set).out = _stdout;
  (data->set).in_set = _stdin;
  (data->set).err = _stderr;
  (data->set).fwrite_func = fwrite;
  (data->set).fread_func_set = fread;
  *(ulong *)&(data->set).field_0x8e2 = *(ulong *)&(data->set).field_0x8e2 & 0xfffffffffffffffe;
  (data->set).seek_func = (curl_seek_callback)0x0;
  (data->set).seek_client = (void *)0x0;
  (data->set).filesize = -1;
  (data->set).postfieldsize = -1;
  (data->set).maxredirs = -1;
  (data->set).method = '\0';
  *(ulong *)&(data->set).field_0x8e2 =
       *(ulong *)&(data->set).field_0x8e2 & 0xfffffffffffff7ff | 0x800;
  *(ulong *)&(data->set).field_0x8e2 =
       *(ulong *)&(data->set).field_0x8e2 & 0xffffffffffffefff | 0x1000;
  *(ulong *)&(data->set).field_0x8e2 = *(ulong *)&(data->set).field_0x8e2 & 0xffffffffffffdfff;
  (data->set).ftp_filemethod = '\x01';
  *(ulong *)&(data->set).field_0x8e2 =
       *(ulong *)&(data->set).field_0x8e2 & 0xffffffffffffbfff | 0x4000;
  (data->set).dns_cache_timeout = 0x3c;
  (data->set).general_ssl.max_ssl_sessions = 5;
  (data->set).proxyport = 0;
  (data->set).proxytype = '\0';
  (data->set).httpauth = 1;
  (data->set).proxyauth = 1;
  (data->set).socks5auth = 5;
  *(ulong *)&(data->set).field_0x8e2 =
       *(ulong *)&(data->set).field_0x8e2 & 0xfffffffffffeffff | 0x10000;
  Curl_mime_initpart(&(data->set).mimepost,data);
  *(ulong *)&(data->set).field_0x8e2 =
       *(ulong *)&(data->set).field_0x8e2 & 0xfff7ffffffffffff | 0x8000000000000;
  *(ulong *)&(data->set).field_0x8e2 =
       *(ulong *)&(data->set).field_0x8e2 & 0xfffbffffffffffff | 0x4000000000000;
  (data->set).ssl.primary.field_0x71 = (data->set).ssl.primary.field_0x71 & 0xfe | 1;
  (data->set).ssl.primary.field_0x71 = (data->set).ssl.primary.field_0x71 & 0xfd | 2;
  (data->set).ssh_auth_types = -1;
  (data->set).ssl.primary.field_0x71 = (data->set).ssl.primary.field_0x71 & 0xf7 | 8;
  memcpy(&(data->set).proxy_ssl,&(data->set).ssl,0xc0);
  (data->set).new_file_perms = 0x1a4;
  (data->set).new_directory_perms = 0x1ed;
  (data->set).allowed_protocols = 0xffffffff;
  (data->set).redir_protocols = 0xf;
  Curl_ssl_backend();
  *(ulong *)&(data->set).field_0x8e2 = *(ulong *)&(data->set).field_0x8e2 & 0xffffffffffff7fff;
  (data->set).chunk_bgn = (curl_chunk_bgn_callback)0x0;
  (data->set).chunk_end = (curl_chunk_end_callback)0x0;
  (data->set).fnmatch = (curl_fnmatch_callback)0x0;
  *(ulong *)&(data->set).field_0x8e2 = *(ulong *)&(data->set).field_0x8e2 & 0xffffffbfffffffff;
  (data->set).tcp_keepintvl = 0x3c;
  (data->set).tcp_keepidle = 0x3c;
  *(ulong *)&(data->set).field_0x8e2 = *(ulong *)&(data->set).field_0x8e2 & 0xffffff7fffffffff;
  *(ulong *)&(data->set).field_0x8e2 =
       *(ulong *)&(data->set).field_0x8e2 & 0xfffffffeffffffff | 0x100000000;
  *(ulong *)&(data->set).field_0x8e2 =
       *(ulong *)&(data->set).field_0x8e2 & 0xfffffeffffffffff | 0x10000000000;
  (data->set).expect_100_timeout = 1000;
  *(ulong *)&(data->set).field_0x8e2 = *(ulong *)&(data->set).field_0x8e2 & 0xfffffffffffffffd | 2;
  (data->set).buffer_size = 0x4000;
  (data->set).upload_buffer_size = 0x10000;
  (data->set).happy_eyeballs_timeout = 200;
  (data->set).upkeep_interval_ms = 60000;
  (data->set).maxconnects = 5;
  (data->set).maxage_conn = 0x76;
  (data->set).maxlifetime_conn = 0;
  *(ulong *)&(data->set).field_0x8e2 = *(ulong *)&(data->set).field_0x8e2 & 0xffdfffffffffffff;
  (data->set).httpwant = '\x04';
  Curl_http2_init_userset(&data->set);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_init_userdefined(struct Curl_easy *data)
{
  struct UserDefined *set = &data->set;
  CURLcode result = CURLE_OK;

  set->out = stdout; /* default output to stdout */
  set->in_set = stdin;  /* default input from stdin */
  set->err  = stderr;  /* default stderr to stderr */

  /* use fwrite as default function to store output */
  set->fwrite_func = (curl_write_callback)fwrite;

  /* use fread as default function to read input */
  set->fread_func_set = (curl_read_callback)fread;
  set->is_fread_set = 0;

  set->seek_func = ZERO_NULL;
  set->seek_client = ZERO_NULL;

  set->filesize = -1;        /* we don't know the size */
  set->postfieldsize = -1;   /* unknown size */
  set->maxredirs = -1;       /* allow any amount by default */

  set->method = HTTPREQ_GET; /* Default HTTP request */
#ifndef CURL_DISABLE_RTSP
  set->rtspreq = RTSPREQ_OPTIONS; /* Default RTSP request */
#endif
#ifndef CURL_DISABLE_FTP
  set->ftp_use_epsv = TRUE;   /* FTP defaults to EPSV operations */
  set->ftp_use_eprt = TRUE;   /* FTP defaults to EPRT operations */
  set->ftp_use_pret = FALSE;  /* mainly useful for drftpd servers */
  set->ftp_filemethod = FTPFILE_MULTICWD;
  set->ftp_skip_ip = TRUE;    /* skip PASV IP by default */
#endif
  set->dns_cache_timeout = 60; /* Timeout every 60 seconds by default */

  /* Set the default size of the SSL session ID cache */
  set->general_ssl.max_ssl_sessions = 5;

  set->proxyport = 0;
  set->proxytype = CURLPROXY_HTTP; /* defaults to HTTP proxy */
  set->httpauth = CURLAUTH_BASIC;  /* defaults to basic */

#ifndef CURL_DISABLE_PROXY
  set->proxyauth = CURLAUTH_BASIC; /* defaults to basic */
  /* SOCKS5 proxy auth defaults to username/password + GSS-API */
  set->socks5auth = CURLAUTH_BASIC | CURLAUTH_GSSAPI;
#endif

  /* make libcurl quiet by default: */
  set->hide_progress = TRUE;  /* CURLOPT_NOPROGRESS changes these */

  Curl_mime_initpart(&set->mimepost, data);

  /*
   * libcurl 7.10 introduced SSL verification *by default*! This needs to be
   * switched off unless wanted.
   */
#ifndef CURL_DISABLE_DOH
  set->doh_verifyhost = TRUE;
  set->doh_verifypeer = TRUE;
#endif
  set->ssl.primary.verifypeer = TRUE;
  set->ssl.primary.verifyhost = TRUE;
#ifdef USE_TLS_SRP
  set->ssl.primary.authtype = CURL_TLSAUTH_NONE;
#endif
   /* defaults to any auth type */
  set->ssh_auth_types = CURLSSH_AUTH_DEFAULT;
  set->ssl.primary.sessionid = TRUE; /* session ID caching enabled by
                                        default */
#ifndef CURL_DISABLE_PROXY
  set->proxy_ssl = set->ssl;
#endif

  set->new_file_perms = 0644;    /* Default permissions */
  set->new_directory_perms = 0755; /* Default permissions */
  set->allowed_protocols = (curl_prot_t) CURLPROTO_ALL;
  set->redir_protocols = CURLPROTO_HTTP | CURLPROTO_HTTPS | CURLPROTO_FTP |
                         CURLPROTO_FTPS;

#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  /*
   * disallow unprotected protection negotiation NEC reference implementation
   * seem not to follow rfc1961 section 4.3/4.4
   */
  set->socks5_gssapi_nec = FALSE;
#endif

  /* Set the default CA cert bundle/path detected/specified at build time.
   *
   * If Schannel is the selected SSL backend then these locations are
   * ignored. We allow setting CA location for schannel only when explicitly
   * specified by the user via CURLOPT_CAINFO / --cacert.
   */
  if(Curl_ssl_backend() != CURLSSLBACKEND_SCHANNEL) {
#if defined(CURL_CA_BUNDLE)
    result = Curl_setstropt(&set->str[STRING_SSL_CAFILE], CURL_CA_BUNDLE);
    if(result)
      return result;

    result = Curl_setstropt(&set->str[STRING_SSL_CAFILE_PROXY],
                            CURL_CA_BUNDLE);
    if(result)
      return result;
#endif
#if defined(CURL_CA_PATH)
    result = Curl_setstropt(&set->str[STRING_SSL_CAPATH], CURL_CA_PATH);
    if(result)
      return result;

    result = Curl_setstropt(&set->str[STRING_SSL_CAPATH_PROXY], CURL_CA_PATH);
    if(result)
      return result;
#endif
  }

#ifndef CURL_DISABLE_FTP
  set->wildcard_enabled = FALSE;
  set->chunk_bgn      = ZERO_NULL;
  set->chunk_end      = ZERO_NULL;
  set->fnmatch = ZERO_NULL;
#endif
  set->tcp_keepalive = FALSE;
  set->tcp_keepintvl = 60;
  set->tcp_keepidle = 60;
  set->tcp_fastopen = FALSE;
  set->tcp_nodelay = TRUE;
  set->ssl_enable_alpn = TRUE;
  set->expect_100_timeout = 1000L; /* Wait for a second by default. */
  set->sep_headers = TRUE; /* separated header lists by default */
  set->buffer_size = READBUFFER_SIZE;
  set->upload_buffer_size = UPLOADBUFFER_DEFAULT;
  set->happy_eyeballs_timeout = CURL_HET_DEFAULT;
  set->upkeep_interval_ms = CURL_UPKEEP_INTERVAL_DEFAULT;
  set->maxconnects = DEFAULT_CONNCACHE_SIZE; /* for easy handles */
  set->maxage_conn = 118;
  set->maxlifetime_conn = 0;
  set->http09_allowed = FALSE;
  set->httpwant =
#ifdef USE_HTTP2
    CURL_HTTP_VERSION_2TLS
#else
    CURL_HTTP_VERSION_1_1
#endif
    ;
  Curl_http2_init_userset(set);
  return result;
}